

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::MessageGenerator
          (MessageGenerator *this,Descriptor *descriptor,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *vars,int index_in_file_messages,Options *options,MessageSCCAnalyzer *scc_analyzer)

{
  FieldGeneratorMap *this_00;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> *this_02;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_03;
  pointer *pppFVar1;
  _Base_ptr *pp_Var2;
  FieldDescriptor FVar3;
  Descriptor *pDVar4;
  iterator __position;
  MessageLayoutHelper *pMVar5;
  pointer ppFVar6;
  FieldDescriptor *descriptor_00;
  MessageSCCAnalyzer *scc_analyzer_00;
  ParseFunctionGenerator *__ptr_00;
  StringPiece injector_template_suffix;
  StringPiece injector_template_suffix_00;
  StringPiece injector_template_suffix_01;
  StringPiece injector_template_suffix_02;
  StringPiece injector_template_suffix_03;
  StringPiece injector_template_prefix;
  StringPiece injector_template_prefix_00;
  StringPiece injector_template_prefix_01;
  StringPiece injector_template_prefix_02;
  StringPiece injector_template_prefix_03;
  byte bVar7;
  pointer pcVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  _Rb_tree_node_base *p_Var11;
  LogMessage *pLVar12;
  ParseFunctionGenerator *this_04;
  Options *options_00;
  long *plVar13;
  long lVar14;
  int iVar15;
  Options *options_01;
  int iVar16;
  _Alloc_hider _Var17;
  AlphaNum *c;
  pointer *__ptr;
  long lVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  pointer ppFVar20;
  bool bVar21;
  StringPiece annotation_name;
  StringPiece annotation_name_00;
  StringPiece annotation_name_01;
  StringPiece annotation_name_02;
  StringPiece annotation_name_03;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  Options *pOVar22;
  Iterator __end3;
  char local_508 [32];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  accessor_annotations_to_hooks;
  value_type field;
  size_t local_4a0;
  undefined4 local_498;
  char local_494;
  char local_493;
  Options *local_478;
  default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator> *local_470;
  Descriptor *local_468;
  Options *local_460;
  string str_index;
  AlphaNum local_438;
  string *local_408;
  string local_400;
  string injector_template;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_360;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_320;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_260;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_220;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_120;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AlphaNum local_60;
  
  this->descriptor_ = descriptor;
  this->index_in_file_messages_ = index_in_file_messages;
  local_408 = &this->classname_;
  ClassName_abi_cxx11_(local_408,(cpp *)descriptor,(Descriptor *)vars);
  pOVar22 = &this->options_;
  Options::Options(pOVar22,options);
  this_00 = &this->field_generators_;
  local_468 = descriptor;
  local_460 = options;
  FieldGeneratorMap::FieldGeneratorMap(this_00,descriptor,options,scc_analyzer);
  this_01 = &this->has_bit_indices_;
  this_02 = &this->inlined_string_indices_;
  this->num_weak_fields_ = 0;
  options_00 = (Options *)&this->parse_function_generator_;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->optimized_order_).
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->max_has_bit_index_ = 0;
  (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->enum_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::EnumGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::EnumGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->extension_generators_).
  super__Vector_base<const_google::protobuf::compiler::cpp::ExtensionGenerator_*,_std::allocator<const_google::protobuf::compiler::cpp::ExtensionGenerator_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->message_layout_helper_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>._M_head_impl
       = (MessageLayoutHelper *)0x0;
  (this->parse_function_generator_)._M_t.
  super___uniq_ptr_impl<google::protobuf::compiler::cpp::ParseFunctionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>_>
  .super__Head_base<0UL,_google::protobuf::compiler::cpp::ParseFunctionGenerator_*,_false>.
  _M_head_impl = (ParseFunctionGenerator *)0x0;
  this->scc_analyzer_ = scc_analyzer;
  this_03 = &this->variables_;
  local_478 = (Options *)&this->message_layout_helper_;
  local_470 = (default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator> *)options_00;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&this_03->_M_t,&vars->_M_t);
  if ((this->message_layout_helper_)._M_t.
      super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
      .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
      _M_head_impl == (MessageLayoutHelper *)0x0) {
    pcVar8 = (pointer)operator_new(8);
    *(undefined ***)pcVar8 = &PTR__MessageLayoutHelper_004d1508;
    (local_478->dllexport_decl)._M_dataplus._M_p = pcVar8;
    options_00 = local_478;
  }
  paVar19 = &injector_template.field_2;
  options_01 = pOVar22;
  injector_template._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&injector_template,"classname","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,&injector_template);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  QualifiedClassName_abi_cxx11_
            (&injector_template,(cpp *)this->descriptor_,(Descriptor *)local_460,options_00);
  pp_Var2 = &accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  accessor_annotations_to_hooks._M_t._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&accessor_annotations_to_hooks,"classtype","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,(key_type *)&accessor_annotations_to_hooks);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&injector_template);
  if ((_Base_ptr *)accessor_annotations_to_hooks._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)accessor_annotations_to_hooks._M_t._M_impl._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  injector_template._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>((string *)&injector_template,"full_name","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,&injector_template);
  std::__cxx11::string::_M_assign((string *)pmVar9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  SuperClassName_abi_cxx11_
            (&injector_template,(cpp *)this->descriptor_,(Descriptor *)pOVar22,options_00);
  accessor_annotations_to_hooks._M_t._M_impl._0_8_ = pp_Var2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&accessor_annotations_to_hooks,"superclass","");
  pOVar22 = local_460;
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,(key_type *)&accessor_annotations_to_hooks);
  std::__cxx11::string::operator=((string *)pmVar9,(string *)&injector_template);
  if ((_Base_ptr *)accessor_annotations_to_hooks._M_t._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)accessor_annotations_to_hooks._M_t._M_impl._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  injector_template._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&injector_template,"annotate_serialize","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,&injector_template);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  injector_template._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&injector_template,"annotate_deserialize","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,&injector_template);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  injector_template._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&injector_template,"annotate_reflection","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,&injector_template);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  injector_template._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&injector_template,"annotate_bytesize","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,&injector_template);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  injector_template._M_dataplus._M_p = (pointer)paVar19;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&injector_template,"annotate_mergefrom","");
  pmVar9 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](this_03,&injector_template);
  std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d75d9);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)injector_template._M_dataplus._M_p != paVar19) {
    operator_delete(injector_template._M_dataplus._M_p);
  }
  if (((pOVar22->field_listener_options).inject_field_listener_events == true) &&
     (*(int *)(*(long *)(*(long *)(local_468 + 0x10) + 0x78) + 0xa0) != 3)) {
    injector_template._M_dataplus._M_p = (pointer)paVar19;
    std::__cxx11::string::_M_construct<char_const*>((string *)&injector_template,"  _tracker_.","");
    injector_template_prefix.length_ = injector_template._M_string_length;
    injector_template_prefix.ptr_ = injector_template._M_dataplus._M_p;
    if ((long)injector_template._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (injector_template._M_string_length,"string length exceeds max size");
    }
    injector_template_suffix.length_ = (size_type)this_03;
    injector_template_suffix.ptr_ = (char *)0x13;
    annotation_name.length_ = 9;
    annotation_name.ptr_ = "serialize";
    anon_unknown_0::MaySetAnnotationVariable
              (pOVar22,annotation_name,injector_template_prefix,injector_template_suffix,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)"OnSerialize(this);\n");
    injector_template_prefix_00.length_ = injector_template._M_string_length;
    injector_template_prefix_00.ptr_ = injector_template._M_dataplus._M_p;
    if ((long)injector_template._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (injector_template._M_string_length,"string length exceeds max size");
    }
    injector_template_suffix_00.length_ = (size_type)this_03;
    injector_template_suffix_00.ptr_ = (char *)0x15;
    annotation_name_00.length_ = 0xb;
    annotation_name_00.ptr_ = "deserialize";
    anon_unknown_0::MaySetAnnotationVariable
              (pOVar22,annotation_name_00,injector_template_prefix_00,injector_template_suffix_00,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)"OnDeserialize(this);\n");
    injector_template_prefix_01.length_ = injector_template._M_string_length;
    injector_template_prefix_01.ptr_ = injector_template._M_dataplus._M_p;
    if ((long)injector_template._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (injector_template._M_string_length,"string length exceeds max size");
    }
    injector_template_suffix_01.length_ = (size_type)this_03;
    injector_template_suffix_01.ptr_ = (char *)0x11;
    annotation_name_01.length_ = 10;
    annotation_name_01.ptr_ = "reflection";
    anon_unknown_0::MaySetAnnotationVariable
              (pOVar22,annotation_name_01,injector_template_prefix_01,injector_template_suffix_01,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)"OnGetMetadata();\n");
    injector_template_prefix_02.length_ = injector_template._M_string_length;
    injector_template_prefix_02.ptr_ = injector_template._M_dataplus._M_p;
    if ((long)injector_template._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (injector_template._M_string_length,"string length exceeds max size");
    }
    injector_template_suffix_02.length_ = (size_type)this_03;
    injector_template_suffix_02.ptr_ = (char *)0x12;
    annotation_name_02.length_ = 8;
    annotation_name_02.ptr_ = "bytesize";
    anon_unknown_0::MaySetAnnotationVariable
              (pOVar22,annotation_name_02,injector_template_prefix_02,injector_template_suffix_02,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)"OnByteSize(this);\n");
    injector_template_prefix_03.length_ = injector_template._M_string_length;
    injector_template_prefix_03.ptr_ = injector_template._M_dataplus._M_p;
    if ((long)injector_template._M_string_length < 0) {
      stringpiece_internal::StringPiece::LogFatalSizeTooBig
                (injector_template._M_string_length,"string length exceeds max size");
    }
    injector_template_suffix_03.length_ = (size_type)this_03;
    injector_template_suffix_03.ptr_ = (char *)0x1a;
    annotation_name_03.length_ = 9;
    annotation_name_03.ptr_ = "mergefrom";
    anon_unknown_0::MaySetAnnotationVariable
              (pOVar22,annotation_name_03,injector_template_prefix_03,injector_template_suffix_03,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)"OnMergeFrom(this, &from);\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)injector_template._M_dataplus._M_p != paVar19) {
      operator_delete(injector_template._M_dataplus._M_p);
    }
  }
  pDVar4 = this->descriptor_;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)&injector_template,(char (*) [23])"annotate_extension_has",
             (char (*) [15])"OnHasExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[25],_const_char_(&)[17],_true>
            (&local_3a0,(char (*) [25])"annotate_extension_clear",(char (*) [17])"OnClearExtension")
  ;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[16],_true>
            (&local_360,(char (*) [33])"annotate_extension_repeated_size",
             (char (*) [16])"OnExtensionSize");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            (&local_320,(char (*) [23])"annotate_extension_get",(char (*) [15])"OnGetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[19],_true>
            (&local_2e0,(char (*) [27])"annotate_extension_mutable",
             (char (*) [19])"OnMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[23],_const_char_(&)[15],_true>
            (&local_2a0,(char (*) [23])"annotate_extension_set",(char (*) [15])"OnSetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[27],_const_char_(&)[19],_true>
            (&local_260,(char (*) [27])"annotate_extension_release",
             (char (*) [19])"OnReleaseExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_220,(char (*) [32])"annotate_repeated_extension_get",
             (char (*) [15])"OnGetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[36],_const_char_(&)[19],_true>
            (&local_1e0,(char (*) [36])"annotate_repeated_extension_mutable",
             (char (*) [19])"OnMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_1a0,(char (*) [32])"annotate_repeated_extension_set",
             (char (*) [15])"OnSetExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[32],_const_char_(&)[15],_true>
            (&local_160,(char (*) [32])"annotate_repeated_extension_add",
             (char (*) [15])"OnAddExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[40],_const_char_(&)[22],_true>
            (&local_120,(char (*) [40])"annotate_repeated_extension_add_mutable",
             (char (*) [22])"OnAddMutableExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[33],_const_char_(&)[16],_true>
            (&local_e0,(char (*) [33])"annotate_repeated_extension_list",
             (char (*) [16])"OnListExtension");
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[41],_const_char_(&)[23],_true>
            (&local_a0,(char (*) [41])"annotate_repeated_extension_list_mutable",
             (char (*) [23])"OnMutableListExtension");
  c = (AlphaNum *)&field;
  __l._M_len = 0xe;
  __l._M_array = (iterator)&injector_template;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&accessor_annotations_to_hooks,__l,
        (less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &__end3,(allocator_type *)c);
  lVar18 = -0x380;
  paVar19 = &local_a0.second.field_2;
  do {
    if (paVar19 !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*(undefined1 **)(paVar19->_M_local_buf + -0x10)) {
      operator_delete(*(undefined1 **)(paVar19->_M_local_buf + -0x10));
    }
    if (paVar19->_M_local_buf + -0x20 != *(char **)(paVar19->_M_local_buf + -0x30)) {
      operator_delete(*(char **)(paVar19->_M_local_buf + -0x30));
    }
    paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(paVar19->_M_local_buf + -0x40);
    lVar18 = lVar18 + 0x40;
  } while (lVar18 != 0);
  p_Var10 = accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var10 !=
         &accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header) {
    accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._M_left = p_Var11;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](this_03,(key_type *)(p_Var10 + 1));
    c = (AlphaNum *)0x0;
    std::__cxx11::string::_M_replace((ulong)pmVar9,0,(char *)pmVar9->_M_string_length,0x3d75d9);
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    p_Var11 = accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  if ((((this->options_).field_listener_options.inject_field_listener_events != false) &&
      (*(int *)(*(long *)(*(long *)(pDVar4 + 0x10) + 0x78) + 0xa0) != 3)) &&
     ((_Rb_tree_header *)p_Var11 !=
      &accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header)) {
    do {
      injector_template._M_dataplus._M_p = (pointer)&injector_template.field_2;
      p_Var10 = p_Var11 + 1;
      injector_template.field_2._M_allocated_capacity = 0x6465746165706572;
      injector_template._M_string_length = 8;
      injector_template.field_2._M_local_buf[8] = '\0';
      bVar21 = false;
      lVar18 = std::__cxx11::string::find
                         ((char *)p_Var10,(ulong)injector_template._M_dataplus._M_p,0);
      if (lVar18 == -1) {
        builtin_strncpy(local_508,"size",5);
        __end3.descriptor = (Descriptor *)0x4;
        bVar21 = false;
        __end3._0_8_ = local_508;
        lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)local_508,0);
        if (lVar18 == -1) {
          local_494 = 'r';
          local_498._0_1_ = 'c';
          local_498._1_1_ = 'l';
          local_498._2_1_ = 'e';
          local_498._3_1_ = 'a';
          local_4a0 = 5;
          local_493 = '\0';
          field = (value_type)&local_498;
          lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)&local_498,0);
          bVar21 = lVar18 == -1;
          if (field != (value_type)&local_498) {
            operator_delete(field);
          }
        }
        if ((char *)__end3._0_8_ != local_508) {
          operator_delete((void *)__end3._0_8_);
        }
      }
      paVar19 = &injector_template.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)injector_template._M_dataplus._M_p != paVar19) {
        operator_delete(injector_template._M_dataplus._M_p);
      }
      if (bVar21) {
        injector_template._M_dataplus._M_p = "  _tracker_.";
        injector_template._M_string_length = 0xc;
        __end3.idx = p_Var11[2]._M_color;
        __end3._4_4_ = *(undefined4 *)&p_Var11[2].field_0x4;
        __end3.descriptor = (Descriptor *)p_Var11[2]._M_parent;
        field = (value_type)anon_var_dwarf_3a48df;
        local_4a0 = 0x62;
        StrCat_abi_cxx11_((string *)&local_438,(protobuf *)&injector_template,(AlphaNum *)&__end3,
                          (AlphaNum *)&field,c);
        pmVar9 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](this_03,(key_type *)p_Var10);
        std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_438);
        _Var17._M_p = local_438.piece_data_;
        if (local_438.piece_data_ != local_438.digits) {
LAB_0029da23:
          operator_delete(_Var17._M_p);
        }
      }
      else {
        injector_template.field_2._M_allocated_capacity = 0x6465746165706572;
        injector_template._M_string_length = 8;
        injector_template.field_2._M_local_buf[8] = '\0';
        bVar21 = false;
        injector_template._M_dataplus._M_p = (pointer)paVar19;
        lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)paVar19,0);
        if (lVar18 != -1) {
          builtin_strncpy(local_508,"list",5);
          __end3.descriptor = (Descriptor *)0x4;
          bVar21 = false;
          __end3._0_8_ = local_508;
          lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)local_508,0);
          if (lVar18 == -1) {
            local_498._0_1_ = 's';
            local_498._1_1_ = 'i';
            local_498._2_1_ = 'z';
            local_498._3_1_ = 'e';
            local_4a0 = 4;
            local_494 = '\0';
            field = (value_type)&local_498;
            lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)&local_498,0);
            bVar21 = lVar18 == -1;
            if (field != (value_type)&local_498) {
              operator_delete(field);
            }
          }
          if ((char *)__end3._0_8_ != local_508) {
            operator_delete((void *)__end3._0_8_);
          }
        }
        paVar19 = &injector_template.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)injector_template._M_dataplus._M_p != paVar19) {
          operator_delete(injector_template._M_dataplus._M_p);
        }
        injector_template._M_dataplus._M_p = (pointer)paVar19;
        if (bVar21) {
          str_index._M_dataplus._M_p = (pointer)&str_index.field_2;
          str_index.field_2._M_local_buf[4] = 'x';
          str_index.field_2._M_allocated_capacity._0_4_ = 0x65646e69;
          str_index._M_string_length = 5;
          str_index.field_2._M_local_buf[5] = '\0';
          injector_template._M_string_length = 3;
          injector_template.field_2._M_allocated_capacity._0_4_ = 0x646461;
          lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)paVar19,0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)injector_template._M_dataplus._M_p != paVar19) {
            operator_delete(injector_template._M_dataplus._M_p);
          }
          if (lVar18 != -1) {
            std::__cxx11::string::_M_replace
                      ((ulong)&str_index,0,(char *)str_index._M_string_length,0x3f7e4e);
          }
          injector_template._M_dataplus._M_p = "  _tracker_.";
          injector_template._M_string_length = 0xc;
          __end3.idx = p_Var11[2]._M_color;
          __end3._4_4_ = *(undefined4 *)&p_Var11[2].field_0x4;
          __end3.descriptor = (Descriptor *)p_Var11[2]._M_parent;
          field = (value_type)anon_var_dwarf_3a492a;
          local_4a0 = 0x49;
          local_438.piece_data_ = str_index._M_dataplus._M_p;
          local_438.piece_size_ = str_index._M_string_length;
          local_60.piece_data_ = "));";
          local_60.piece_size_ = 3;
          c = &local_438;
          StrCat_abi_cxx11_(&local_400,(protobuf *)&injector_template,(AlphaNum *)&__end3,
                            (AlphaNum *)&field,c,&local_60,(AlphaNum *)options_01);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](this_03,(key_type *)p_Var10);
          std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_400);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_400._M_dataplus._M_p != &local_400.field_2) {
            operator_delete(local_400._M_dataplus._M_p);
          }
          _Var17._M_p = str_index._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)str_index._M_dataplus._M_p != &str_index.field_2) goto LAB_0029da23;
        }
        else {
          injector_template._M_string_length = 4;
          injector_template.field_2._M_allocated_capacity._0_5_ = 0x7473696c;
          lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)paVar19,0);
          bVar21 = true;
          if (lVar18 == -1) {
            builtin_strncpy(local_508,"size",5);
            __end3.descriptor = (Descriptor *)0x4;
            __end3._0_8_ = local_508;
            lVar18 = std::__cxx11::string::find((char *)p_Var10,(ulong)local_508,0);
            bVar21 = lVar18 != -1;
            if ((char *)__end3._0_8_ != local_508) {
              operator_delete((void *)__end3._0_8_);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)injector_template._M_dataplus._M_p != &injector_template.field_2) {
            operator_delete(injector_template._M_dataplus._M_p);
          }
          if (bVar21) {
            injector_template._M_dataplus._M_p = "  _tracker_.";
            injector_template._M_string_length = 0xc;
            __end3.idx = p_Var11[2]._M_color;
            __end3._4_4_ = *(undefined4 *)&p_Var11[2].field_0x4;
            __end3.descriptor = (Descriptor *)p_Var11[2]._M_parent;
            field = (value_type)anon_var_dwarf_3a4944;
            local_4a0 = 0x52;
            StrCat_abi_cxx11_((string *)&local_438,(protobuf *)&injector_template,
                              (AlphaNum *)&__end3,(AlphaNum *)&field,c);
            pmVar9 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[](this_03,(key_type *)p_Var10);
            std::__cxx11::string::operator=((string *)pmVar9,(string *)&local_438);
            _Var17._M_p = local_438.piece_data_;
            if (local_438.piece_data_ != local_438.digits) goto LAB_0029da23;
          }
        }
      }
      p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
    } while ((_Rb_tree_header *)p_Var11 !=
             &accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&accessor_annotations_to_hooks._M_t);
  SetUnknownFieldsVariable(this->descriptor_,options_01,this_03);
  __end3.descriptor = this->descriptor_;
  accessor_annotations_to_hooks._M_t._M_impl._0_8_ =
       accessor_annotations_to_hooks._M_t._M_impl._0_8_ & 0xffffffff00000000;
  __end3.idx = *(int *)(__end3.descriptor + 4);
  accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
       __end3.descriptor;
  while (bVar21 = operator==((Iterator *)&accessor_annotations_to_hooks,&__end3), !bVar21) {
    field = (value_type)
            (*(long *)(accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header.
                       _0_8_ + 0x28) +
            (long)(int)accessor_annotations_to_hooks._M_t._M_impl._0_4_ * 0x48);
    if (*(char *)(*(long *)(field + 0x38) + 0x4f) == '\x01') {
      if ((this->options_).opensource_runtime == true) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&injector_template,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.h"
                   ,0x138);
        pLVar12 = internal::LogMessage::operator<<
                            ((LogMessage *)&injector_template,
                             "CHECK failed: !options.opensource_runtime: ");
        internal::LogFinisher::operator=((LogFinisher *)&local_438,pLVar12);
        internal::LogMessage::~LogMessage((LogMessage *)&injector_template);
      }
      this->num_weak_fields_ = this->num_weak_fields_ + 1;
    }
    else {
      lVar18 = *(long *)(field + 0x28);
      if ((lVar18 == 0 || ((byte)field[1] & 0x10) == 0) ||
         ((*(int *)(lVar18 + 4) == 1 && ((*(byte *)(*(long *)(lVar18 + 0x20) + 1) & 2) != 0)))) {
        __position._M_current =
             (this->optimized_order_).
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                    ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                      *)&this->optimized_order_,__position,&field);
        }
        else {
          *__position._M_current = field;
          pppFVar1 = &(this->optimized_order_).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppFVar1 = *pppFVar1 + 1;
        }
      }
    }
    accessor_annotations_to_hooks._M_t._M_impl._0_4_ =
         accessor_annotations_to_hooks._M_t._M_impl._0_4_ + 1;
  }
  pMVar5 = (this->message_layout_helper_)._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::cpp::MessageLayoutHelper,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
           ._M_t.
           super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_std::default_delete<google::protobuf::compiler::cpp::MessageLayoutHelper>_>
           .super__Head_base<0UL,_google::protobuf::compiler::cpp::MessageLayoutHelper_*,_false>.
           _M_head_impl;
  pOVar22 = options_01;
  (*pMVar5->_vptr_MessageLayoutHelper[2])
            (pMVar5,&this->optimized_order_,options_01,this->scc_analyzer_);
  ppFVar6 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar20 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppFVar20 != ppFVar6;
      ppFVar20 = ppFVar20 + 1) {
    descriptor_00 = *ppFVar20;
    FVar3 = descriptor_00[1];
    if (((byte)FVar3 & 2) == 0) {
      if ((((byte)FVar3 & 0x60) == 0x20) &&
         (*(char *)(*(long *)(descriptor_00 + 0x10) + 0x3a) == '\x02')) {
        if ((((byte)FVar3 & 0x10) == 0) || (*(long *)(descriptor_00 + 0x28) == 0))
        goto LAB_0029dbfb;
      }
      else if (((byte)FVar3 & 0x60) == 0x40) goto LAB_0029dbfb;
    }
    else {
LAB_0029dbfb:
      if (*(char *)(*(long *)(descriptor_00 + 0x38) + 0x4f) == '\0') {
        if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<int,_std::allocator<int>_>::resize
                    (this_01,(long)*(int *)(this->descriptor_ + 4),&(anonymous_namespace)::kNoHasbit
                    );
        }
        iVar15 = this->max_has_bit_index_;
        this->max_has_bit_index_ = iVar15 + 1;
        if (((byte)descriptor_00[1] & 8) == 0) {
          plVar13 = (long *)(*(long *)(descriptor_00 + 0x20) + 0x28);
        }
        else if (*(long *)(descriptor_00 + 0x28) == 0) {
          plVar13 = (long *)(*(long *)(descriptor_00 + 0x10) + 0x70);
        }
        else {
          plVar13 = (long *)(*(long *)(descriptor_00 + 0x28) + 0x50);
        }
        (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[(int)((ulong)((long)descriptor_00 - *plVar13) >> 3) * 0x38e38e39] = iVar15;
      }
    }
    bVar21 = IsStringInlined(descriptor_00,options_01);
    if (bVar21) {
      if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<int,_std::allocator<int>_>::resize
                  (this_02,(long)*(int *)(this->descriptor_ + 4),&(anonymous_namespace)::kNoHasbit);
      }
      iVar15 = this->max_inlined_string_index_;
      this->max_inlined_string_index_ = iVar15 + 1;
      if (((byte)descriptor_00[1] & 8) == 0) {
        plVar13 = (long *)(*(long *)(descriptor_00 + 0x20) + 0x28);
      }
      else if (*(long *)(descriptor_00 + 0x28) == 0) {
        plVar13 = (long *)(*(long *)(descriptor_00 + 0x10) + 0x70);
      }
      else {
        plVar13 = (long *)(*(long *)(descriptor_00 + 0x28) + 0x50);
      }
      (this_02->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_start[(int)((ulong)((long)descriptor_00 - *plVar13) >> 3) * 0x38e38e39] = iVar15;
    }
  }
  if ((this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->has_bit_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FieldGeneratorMap::SetHasBitIndices(this_00,this_01);
  }
  if ((this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (this->inlined_string_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    FieldGeneratorMap::SetInlinedStringIndices(this_00,this_02);
  }
  this->num_required_fields_ = 0;
  iVar15 = *(int *)(local_468 + 4);
  if (0 < (long)iVar15) {
    lVar18 = *(long *)(local_468 + 0x28);
    lVar14 = 0;
    iVar16 = 0;
    do {
      if ((*(byte *)(lVar18 + 1 + lVar14) & 0x60) == 0x40) {
        iVar16 = iVar16 + 1;
        this->num_required_fields_ = iVar16;
      }
      lVar14 = lVar14 + 0x48;
    } while ((long)iVar15 * 0x48 != lVar14);
  }
  if ((this->options_).table_driven_parsing == true) {
    pDVar4 = this->descriptor_;
    iVar15 = *(int *)(pDVar4 + 4);
    if (0 < (long)iVar15) {
      scc_analyzer_00 = this->scc_analyzer_;
      lVar18 = *(long *)(pDVar4 + 0x28);
      lVar14 = 0;
      do {
        bVar7 = *(byte *)(lVar18 + 1 + lVar14);
        if ((bVar7 & 2) == 0) {
          if (((bVar7 & 0x60) == 0x20) &&
             (*(char *)(*(long *)(lVar18 + 0x10 + lVar14) + 0x3a) == '\x02')) {
            if (((bVar7 & 0x10) == 0) || (*(long *)(lVar18 + 0x28 + lVar14) == 0))
            goto LAB_0029de16;
          }
          else if ((bVar7 & 0x60) == 0x40) goto LAB_0029de16;
        }
        else {
LAB_0029de16:
          if (*(char *)(*(long *)(lVar18 + 0x38 + lVar14) + 0x4f) != '\x01') {
            accessor_annotations_to_hooks._M_t._M_impl._0_8_ =
                 accessor_annotations_to_hooks._M_t._M_impl._0_8_ & 0xffffffff00000000;
            __end3.idx = iVar15;
            __end3.descriptor = pDVar4;
            accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
                 pDVar4;
            bVar21 = operator==((Iterator *)&accessor_annotations_to_hooks,&__end3);
            iVar15 = 0;
            options_01 = pOVar22;
            if (bVar21) goto LAB_0029deba;
            goto LAB_0029deee;
          }
        }
        lVar14 = lVar14 + 0x48;
      } while ((long)iVar15 * 0x48 != lVar14);
    }
  }
  bVar7 = false;
  goto LAB_0029de2c;
  while( true ) {
    bVar21 = IsLazy((FieldDescriptor *)(lVar18 + lVar14 * 0x48),pOVar22,scc_analyzer_00);
    options_01 = pOVar22;
    if (bVar21) goto LAB_0029dfa4;
    accessor_annotations_to_hooks._M_t._M_impl._0_4_ =
         accessor_annotations_to_hooks._M_t._M_impl._0_4_ + 1;
    bVar21 = operator==((Iterator *)&accessor_annotations_to_hooks,&__end3);
    if (bVar21) break;
LAB_0029deee:
    lVar14 = (long)(int)accessor_annotations_to_hooks._M_t._M_impl._0_4_;
    lVar18 = *(long *)(accessor_annotations_to_hooks._M_t._M_impl.super__Rb_tree_header._M_header.
                       _0_8_ + 0x28);
    iVar16 = *(int *)(lVar18 + 4 + lVar14 * 0x48);
    if (iVar16 < iVar15) {
      iVar16 = iVar15;
    }
    iVar15 = iVar16;
    if (*(char *)(*(long *)(lVar18 + 0x38 + lVar14 * 0x48) + 0x4f) == '\x01') {
      options_01 = pOVar22;
      if ((this->options_).opensource_runtime == true) {
        internal::LogMessage::LogMessage
                  ((LogMessage *)&injector_template,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_helpers.h"
                   ,0x138);
        pLVar12 = internal::LogMessage::operator<<
                            ((LogMessage *)&injector_template,
                             "CHECK failed: !options.opensource_runtime: ");
        internal::LogFinisher::operator=((LogFinisher *)&field,pLVar12);
        internal::LogMessage::~LogMessage((LogMessage *)&injector_template);
        options_01 = pOVar22;
      }
      goto LAB_0029dfa4;
    }
  }
  options_01 = pOVar22;
  if (iVar15 < 0x8000) {
LAB_0029deba:
    if ((double)iVar15 * 0.5 <= (double)*(int *)(pDVar4 + 4)) {
      bVar7 = *(byte *)(*(long *)(pDVar4 + 0x20) + 0x4b) ^ 1;
      goto LAB_0029de2c;
    }
  }
LAB_0029dfa4:
  bVar7 = false;
LAB_0029de2c:
  this->table_driven_ = (bool)bVar7;
  this_04 = (ParseFunctionGenerator *)operator_new(0x70);
  ParseFunctionGenerator::ParseFunctionGenerator
            (this_04,this->descriptor_,this->max_has_bit_index_,this_01,this_02,options_01,
             this->scc_analyzer_,this_03);
  __ptr_00 = *(ParseFunctionGenerator **)&local_470->field_0x0;
  *(ParseFunctionGenerator **)&local_470->field_0x0 = this_04;
  if (__ptr_00 != (ParseFunctionGenerator *)0x0) {
    std::default_delete<google::protobuf::compiler::cpp::ParseFunctionGenerator>::operator()
              (local_470,__ptr_00);
  }
  return;
}

Assistant:

MessageGenerator::MessageGenerator(
    const Descriptor* descriptor,
    const std::map<std::string, std::string>& vars, int index_in_file_messages,
    const Options& options, MessageSCCAnalyzer* scc_analyzer)
    : descriptor_(descriptor),
      index_in_file_messages_(index_in_file_messages),
      classname_(ClassName(descriptor, false)),
      options_(options),
      field_generators_(descriptor, options, scc_analyzer),
      max_has_bit_index_(0),
      max_inlined_string_index_(0),
      num_weak_fields_(0),
      scc_analyzer_(scc_analyzer),
      variables_(vars) {
  if (!message_layout_helper_) {
    message_layout_helper_.reset(new PaddingOptimizer());
  }

  // Variables that apply to this class
  variables_["classname"] = classname_;
  variables_["classtype"] = QualifiedClassName(descriptor_, options);
  variables_["full_name"] = descriptor_->full_name();
  variables_["superclass"] = SuperClassName(descriptor_, options_);
  variables_["annotate_serialize"] = "";
  variables_["annotate_deserialize"] = "";
  variables_["annotate_reflection"] = "";
  variables_["annotate_bytesize"] = "";
  variables_["annotate_mergefrom"] = "";

  if (options.field_listener_options.inject_field_listener_events &&
      descriptor->file()->options().optimize_for() !=
          google::protobuf::FileOptions::LITE_RUNTIME) {
    const std::string injector_template = "  _tracker_.";

    MaySetAnnotationVariable(options, "serialize", injector_template,
                             "OnSerialize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "deserialize", injector_template,
                             "OnDeserialize(this);\n", &variables_);
    // TODO(danilak): Ideally annotate_reflection should not exist and we need
    // to annotate all reflective calls on our own, however, as this is a cause
    // for side effects, i.e. reading values dynamically, we want the users know
    // that dynamic access can happen.
    MaySetAnnotationVariable(options, "reflection", injector_template,
                             "OnGetMetadata();\n", &variables_);
    MaySetAnnotationVariable(options, "bytesize", injector_template,
                             "OnByteSize(this);\n", &variables_);
    MaySetAnnotationVariable(options, "mergefrom", injector_template,
                             "OnMergeFrom(this, &from);\n", &variables_);
  }

  GenerateExtensionAnnotations(descriptor_, options_, &variables_);

  SetUnknownFieldsVariable(descriptor_, options_, &variables_);

  // Compute optimized field order to be used for layout and initialization
  // purposes.
  for (auto field : FieldRange(descriptor_)) {
    if (IsFieldStripped(field, options_)) {
      continue;
    }

    if (IsWeak(field, options_)) {
      num_weak_fields_++;
    } else if (!field->real_containing_oneof()) {
      optimized_order_.push_back(field);
    }
  }

  message_layout_helper_->OptimizeLayout(&optimized_order_, options_,
                                         scc_analyzer_);

  // This message has hasbits iff one or more fields need one.
  for (auto field : optimized_order_) {
    if (HasHasbit(field)) {
      if (has_bit_indices_.empty()) {
        has_bit_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      has_bit_indices_[field->index()] = max_has_bit_index_++;
    }
    if (IsStringInlined(field, options_)) {
      if (inlined_string_indices_.empty()) {
        inlined_string_indices_.resize(descriptor_->field_count(), kNoHasbit);
      }
      inlined_string_indices_[field->index()] = max_inlined_string_index_++;
    }
  }

  if (!has_bit_indices_.empty()) {
    field_generators_.SetHasBitIndices(has_bit_indices_);
  }

  if (!inlined_string_indices_.empty()) {
    field_generators_.SetInlinedStringIndices(inlined_string_indices_);
  }

  num_required_fields_ = 0;
  for (int i = 0; i < descriptor->field_count(); i++) {
    if (descriptor->field(i)->is_required()) {
      ++num_required_fields_;
    }
  }

  table_driven_ =
      TableDrivenParsingEnabled(descriptor_, options_, scc_analyzer_);
  parse_function_generator_.reset(new ParseFunctionGenerator(
      descriptor_, max_has_bit_index_, has_bit_indices_,
      inlined_string_indices_, options_, scc_analyzer_, variables_));
}